

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O3

size_type __thiscall re2::StringPiece::find(StringPiece *this,StringPiece *s,size_type pos)

{
  char *pcVar1;
  size_type sVar2;
  size_type sVar3;
  
  sVar2 = 0xffffffffffffffff;
  if (pos <= this->size_) {
    pcVar1 = std::__search<char_const*,char_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                       (this->data_ + pos,this->data_ + this->size_,s->data_,s->data_ + s->size_);
    sVar3 = (long)pcVar1 - (long)this->data_;
    sVar2 = 0xffffffffffffffff;
    if (s->size_ + sVar3 <= this->size_) {
      sVar2 = sVar3;
    }
  }
  return sVar2;
}

Assistant:

StringPiece::size_type StringPiece::find(const StringPiece& s,
                                         size_type pos) const {
  if (pos > size_) return npos;
  const_pointer result = std::search(data_ + pos, data_ + size_,
                                     s.data_, s.data_ + s.size_);
  size_type xpos = result - data_;
  return xpos + s.size_ <= size_ ? xpos : npos;
}